

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O1

void __thiscall
randomx::JitCompilerX86::generateProgramEpilogue
          (JitCompilerX86 *this,Program *prog,ProgramConfiguration *pcfg)

{
  int iVar1;
  uint8_t *puVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  size_t __n;
  
  puVar2 = this->code;
  iVar3 = this->codePos;
  (puVar2 + iVar3)[0] = 'I';
  (puVar2 + iVar3)[1] = 0x8b;
  iVar3 = this->codePos + 2;
  this->codePos = iVar3;
  this->code[iVar3] = (char)pcfg->readReg0 + 0xc0;
  iVar3 = this->codePos;
  this->codePos = iVar3 + 1;
  puVar2 = this->code;
  (puVar2 + (long)iVar3 + 1)[0] = 'I';
  (puVar2 + (long)iVar3 + 1)[1] = '3';
  iVar3 = this->codePos + 2;
  this->codePos = iVar3;
  this->code[iVar3] = (char)pcfg->readReg1 + 0xc0;
  lVar5 = (long)this->codePos + 1;
  this->codePos = (int32_t)lVar5;
  memcpy(this->code + lVar5,randomx_prefetch_scratchpad,0x1a);
  iVar3 = this->codePos + 0x1a;
  this->codePos = iVar3;
  __n = (size_t)loopStoreSize;
  memcpy(this->code + iVar3,_codeLoopStore,__n);
  lVar5 = (long)this->codePos + __n;
  uVar4 = (uint)lVar5;
  this->codePos = uVar4;
  if ((BranchesWithin32B == '\x01') && (0x1f < (uVar4 + 9 ^ uVar4))) {
    uVar4 = uVar4 & 0x1f;
    if (uVar4 < 0x18) {
      memcpy(this->code + lVar5,*(void **)(NOPX + (ulong)(0x17 - uVar4) * 8),(ulong)(0x18 - uVar4));
      this->codePos = this->codePos + (0x18 - uVar4);
      uVar4 = 8;
    }
    else {
      uVar4 = 0x20 - uVar4;
    }
    memcpy(this->code + this->codePos,*(void **)(NOPX + (ulong)(uVar4 - 1) * 8),(ulong)uVar4);
    this->codePos = this->codePos + uVar4;
  }
  puVar2 = this->code;
  iVar3 = this->codePos;
  puVar2[(long)iVar3 + 2] = '\x01';
  puVar2 = puVar2 + iVar3;
  puVar2[0] = 0x83;
  puVar2[1] = 0xeb;
  iVar3 = this->codePos + 3;
  this->codePos = iVar3;
  puVar2 = this->code;
  (puVar2 + iVar3)[0] = '\x0f';
  (puVar2 + iVar3)[1] = 0x85;
  iVar1 = this->codePos;
  iVar3 = iVar1 + 2;
  this->codePos = iVar3;
  *(int *)(this->code + iVar3) = (prologueSize - iVar1) + -6;
  iVar3 = this->codePos + 4;
  this->codePos = iVar3;
  this->code[iVar3] = 0xe9;
  iVar3 = this->codePos;
  this->codePos = iVar3 + 1;
  *(int *)(this->code + (long)iVar3 + 1) = (epilogueOffset - iVar3) + -5;
  this->codePos = this->codePos + 4;
  return;
}

Assistant:

void JitCompilerX86::generateProgramEpilogue(Program& prog, ProgramConfiguration& pcfg) {
		emit(REX_MOV_RR64);
		emitByte(0xc0 + pcfg.readReg0);
		emit(REX_XOR_RAX_R64);
		emitByte(0xc0 + pcfg.readReg1);
		emit((const uint8_t*)&randomx_prefetch_scratchpad, ((uint8_t*)&randomx_prefetch_scratchpad_end) - ((uint8_t*)&randomx_prefetch_scratchpad));
		memcpy(code + codePos, codeLoopStore, loopStoreSize);
		codePos += loopStoreSize;

		if (BranchesWithin32B) {
			const uint32_t branch_begin = static_cast<uint32_t>(codePos);
			const uint32_t branch_end = static_cast<uint32_t>(branch_begin + 9);

			// If the jump crosses or touches 32-byte boundary, align it
			if ((branch_begin ^ branch_end) >= 32) {
				uint32_t alignment_size = 32 - (branch_begin & 31);
				if (alignment_size > 8) {
					emit(NOPX[alignment_size - 9], alignment_size - 8);
					alignment_size = 8;
				}
				emit(NOPX[alignment_size - 1], alignment_size);
			}
		}

		emit(SUB_EBX);
		emit(JNZ);
		emit32(prologueSize - codePos - 4);
		emitByte(JMP);
		emit32(epilogueOffset - codePos - 4);
	}